

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf16_range.cc
# Opt level: O0

void re2c::UTF16splitByRuneLength(RangeSuffix **root,rune l,rune h)

{
  uint32_t uVar1;
  uint32_t uVar2;
  uint32_t h_ld_00;
  uint32_t h_tr_00;
  uint32_t h_tr_1;
  uint32_t h_ld_1;
  uint32_t l_tr;
  uint32_t l_ld;
  uint32_t h_tr;
  uint32_t h_ld;
  rune h_local;
  rune l_local;
  RangeSuffix **root_local;
  
  if (l < 0x10000) {
    if (h < 0x10000) {
      UTF16addContinuous1(root,l,h);
    }
    else {
      UTF16addContinuous1(root,l,0xffff);
      uVar1 = utf16::lead_surr(h);
      uVar2 = utf16::trail_surr(h);
      UTF16splitByContinuity(root,0xd800,uVar1,0xdc00,uVar2);
    }
  }
  else {
    uVar1 = utf16::lead_surr(l);
    uVar2 = utf16::trail_surr(l);
    h_ld_00 = utf16::lead_surr(h);
    h_tr_00 = utf16::trail_surr(h);
    UTF16splitByContinuity(root,uVar1,h_ld_00,uVar2,h_tr_00);
  }
  return;
}

Assistant:

void UTF16splitByRuneLength(RangeSuffix * & root, utf16::rune l, utf16::rune h)
{
	if (l <= utf16::MAX_1WORD_RUNE)
	{
		if (h <= utf16::MAX_1WORD_RUNE)
		{
			UTF16addContinuous1(root, l, h);
		}
		else
		{
			UTF16addContinuous1(root, l, utf16::MAX_1WORD_RUNE);
			const uint32_t h_ld = utf16::lead_surr(h);
			const uint32_t h_tr = utf16::trail_surr(h);
			UTF16splitByContinuity(root, utf16::MIN_LEAD_SURR, h_ld, utf16::MIN_TRAIL_SURR, h_tr);
		}
	}
	else
	{
			const uint32_t l_ld = utf16::lead_surr(l);
			const uint32_t l_tr = utf16::trail_surr(l);
			const uint32_t h_ld = utf16::lead_surr(h);
			const uint32_t h_tr = utf16::trail_surr(h);
			UTF16splitByContinuity(root, l_ld, h_ld, l_tr, h_tr);
	}
}